

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

PAL_ERROR MAPGrowLocalFile(INT UnixFD,UINT NewSize)

{
  int iVar1;
  uint uVar2;
  __off64_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  bool bVar6;
  UINT UVar7;
  PAL_ERROR PVar8;
  long in_FS_OFFSET;
  undefined1 local_158 [8];
  stat FileInfo;
  undefined1 local_b8 [8];
  BYTE buf [128];
  
  buf._120_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if (!PAL_InitializeChakraCoreCalled) {
LAB_0012f262:
    abort();
  }
  iVar1 = ftruncate64(UnixFD,(ulong)NewSize);
  fstat64(UnixFD,(stat64 *)local_158);
  if ((iVar1 == 0) && (PVar8 = 0, FileInfo.st_rdev == (long)(int)NewSize)) goto LAB_0012f209;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f262;
  PVar8 = 0;
  bVar6 = true;
  FileInfo.__glibc_reserved[2] = lseek64(UnixFD,0,1);
  _Var3 = lseek64(UnixFD,0,2);
  uVar2 = (uint)_Var3;
  if (uVar2 == 0xffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f262;
    piVar5 = __errno_location();
    strerror(*piVar5);
LAB_0012f1f7:
    bVar6 = false;
    PVar8 = 0x54f;
  }
  else {
    iVar1 = NewSize - uVar2;
    if (uVar2 <= NewSize && iVar1 != 0) {
      UVar7 = 0;
      memset(local_b8,0,0x80);
      if (iVar1 != 0x80) {
        UVar7 = 0;
        do {
          sVar4 = write(UnixFD,local_b8,0x80);
          if (sVar4 == -1) goto LAB_0012f22d;
          UVar7 = UVar7 + 0x80;
        } while (UVar7 < iVar1 - 0x80U);
      }
      if ((UVar7 == NewSize) || (sVar4 = write(UnixFD,local_b8,(ulong)(iVar1 - UVar7)), sVar4 != -1)
         ) {
        PVar8 = 0;
        lseek64(UnixFD,FileInfo.__glibc_reserved[2] & 0xffffffff,0);
        bVar6 = false;
      }
      else {
LAB_0012f22d:
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012f262;
        piVar5 = __errno_location();
        strerror(*piVar5);
        bVar6 = false;
        PVar8 = 0x70;
        if ((*piVar5 != 0x1c) && (*piVar5 != 0x7a)) goto LAB_0012f1f7;
      }
    }
  }
  if (bVar6) {
    PVar8 = 1;
  }
LAB_0012f209:
  if (*(long *)(in_FS_OFFSET + 0x28) != buf._120_8_) {
    __stack_chk_fail();
  }
  return PVar8;
}

Assistant:

static PAL_ERROR MAPGrowLocalFile( INT UnixFD, UINT NewSize )
{
    PAL_ERROR palError = NO_ERROR;
    INT  TruncateRetVal = -1;
    struct stat FileInfo;
    TRACE( "Entered MapGrowLocalFile (UnixFD=%d,NewSize%d)\n", UnixFD, NewSize );

    //
    // TODO: can we add configure flags to model the behavior of ftruncate
    // among our various target platforms? How much would that actually gain
    // us?
    //

    /* ftruncate is a standard function, but the behavior of enlarging files is
    non-standard.  So I will try to enlarge a file, and if that fails try the
    less efficent way.*/
    TruncateRetVal = ftruncate( UnixFD, NewSize );
    fstat( UnixFD, &FileInfo );

    if ( TruncateRetVal != 0 || FileInfo.st_size != (int) NewSize )
    {
        INT OrigSize;
        CONST UINT  BUFFER_SIZE = 128;
        BYTE buf[BUFFER_SIZE];
        UINT x = 0;
        UINT CurrentPosition = 0;

        TRACE( "Trying the less efficent way.\n" );

        CurrentPosition = lseek( UnixFD, 0, SEEK_CUR );
        OrigSize = lseek( UnixFD, 0, SEEK_END );
        if ( OrigSize == -1 )
        {
            ERROR( "Unable to locate the EOF marker. Reason=%s\n",
                   strerror( errno ) );
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        if (NewSize <= (UINT) OrigSize)
        {
            return TRUE;
        }

        memset( buf, 0, BUFFER_SIZE );

        for ( x = 0; x < NewSize - OrigSize - BUFFER_SIZE; x += BUFFER_SIZE )
        {
            if ( write( UnixFD, (LPVOID)buf, BUFFER_SIZE ) == -1 )
            {
                ERROR( "Unable to grow the file. Reason=%s\n", strerror( errno ) );
                if((errno == ENOSPC) || (errno == EDQUOT))
                {
                    palError = ERROR_DISK_FULL;
                }
                else
                {
                    palError = ERROR_INTERNAL_ERROR;
                }
                goto done;
            }
        }
        /* Catch any left overs. */
        if ( x != NewSize )
        {
            if ( write( UnixFD, (LPVOID)buf, NewSize - OrigSize - x) == -1 )
            {
                ERROR( "Unable to grow the file. Reason=%s\n", strerror( errno ) );
                if((errno == ENOSPC) || (errno == EDQUOT))
                {
                    palError = ERROR_DISK_FULL;
                }
                else
                {
                    palError = ERROR_INTERNAL_ERROR;
                }
                goto done;
            }
        }

        /* restore the file pointer position */
        lseek( UnixFD, CurrentPosition, SEEK_SET );
    }

done:
    return palError;
}